

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Abc_Ntk_t *pNtk_00;
  FILE *__stream;
  Abc_Cex_t *pAVar8;
  Abc_Obj_t *pObj;
  char *pcVar9;
  Abc_Cex_t *local_b8;
  uint local_70;
  int Entry;
  int i;
  int Status;
  FILE *pFile;
  Abc_Cex_t *pTemp_1;
  int Counter;
  int nCexes;
  Abc_Cex_t *pTemp;
  char *pLogFileName;
  int fShort;
  int fOutStatus;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  bVar2 = true;
  pTemp = (Abc_Cex_t *)0x0;
  Extra_UtilGetoptReset();
LAB_00263bb0:
  iVar3 = Extra_UtilGetopt(argc,argv,"Losh");
  if (iVar3 == -1) {
    if (bVar1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_NtkPrintPoEquivs(pNtk_00);
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      if (pAbc->vStatuses == (Vec_Int_t *)0x0) {
        Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status,
                  (ulong)(uint)pAbc->nFrames);
      }
      if ((pAbc->pCex == (Abc_Cex_t *)0x0) && (pAbc->vCexVec == (Vec_Ptr_t *)0x0)) {
        Abc_Print(1,"Cex is not defined.\n");
      }
      else {
        if (pAbc->pCex != (Abc_Cex_t *)0x0) {
          Abc_CexPrintStats(pAbc->pCex);
        }
        if (pAbc->vCexVec != (Vec_Ptr_t *)0x0) {
          for (fShort = 0; iVar3 = Vec_PtrSize(pAbc->vCexVec), fShort < iVar3; fShort = fShort + 1)
          {
            pAVar8 = (Abc_Cex_t *)Vec_PtrEntry(pAbc->vCexVec,fShort);
            if ((pAVar8 != (Abc_Cex_t *)0x1) && (pAVar8 != (Abc_Cex_t *)0x0)) {
              printf("%4d : ");
              Abc_CexPrintStats(pAVar8);
            }
          }
        }
      }
      if (pAbc->vStatuses != (Vec_Int_t *)0x0) {
        if (pTemp == (Abc_Cex_t *)0x0) {
          if (bVar2) {
            uVar4 = Vec_IntCountEntry(pAbc->vStatuses,0);
            uVar5 = Vec_IntCountEntry(pAbc->vStatuses,1);
            uVar6 = Vec_IntCountEntry(pAbc->vStatuses,-1);
            uVar7 = Vec_IntSize(pAbc->vStatuses);
            printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
                   (ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
          }
          else {
            for (local_70 = 0; iVar3 = Vec_IntSize(pAbc->vStatuses), (int)local_70 < iVar3;
                local_70 = local_70 + 1) {
              uVar4 = Vec_IntEntry(pAbc->vStatuses,local_70);
              printf("%d=%d  ",(ulong)local_70,(ulong)uVar4);
            }
          }
        }
        else {
          __stream = fopen((char *)pTemp,"wb");
          if (__stream == (FILE *)0x0) {
            printf("Cannot open file \"%s\" for writing.\n",pTemp);
            return 0;
          }
          for (fShort = 0; iVar3 = Vec_PtrSize(pAbc->vCexVec), fShort < iVar3; fShort = fShort + 1)
          {
            pAVar8 = (Abc_Cex_t *)Vec_PtrEntry(pAbc->vCexVec,fShort);
            iVar3 = Vec_IntEntry(pAbc->vStatuses,fShort);
            if (iVar3 == -1) {
              fprintf(__stream,"STATUS: ABORTED ");
            }
            else if (iVar3 == 0) {
              fprintf(__stream,"STATUS: SAT ");
            }
            else if (iVar3 == 1) {
              fprintf(__stream,"STATUS: UNSAT ");
            }
            pObj = Abc_NtkPo(pNtk_00,fShort);
            pcVar9 = Abc_ObjName(pObj);
            fprintf(__stream,"%s\n",pcVar9);
            if (iVar3 == 0) {
              Abc_NtkDumpOneCexSpecial((FILE *)__stream,pNtk_00,pAVar8);
            }
          }
          fclose(__stream);
        }
        printf("\n");
      }
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar3) {
  case 0x4c:
    if (globalUtilOptind < argc) {
      pTemp = (Abc_Cex_t *)argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00263bb0;
    }
    Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
    break;
  default:
    break;
  case 0x68:
    break;
  case 0x6f:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00263bb0;
  case 0x73:
    goto switchD_00263bf6_caseD_73;
  }
  Abc_Print(-2,"usage: print_status [-L file] [-osh]\n");
  Abc_Print(-2,"\t          prints verification status\n");
  if (pTemp == (Abc_Cex_t *)0x0) {
    local_b8 = (Abc_Cex_t *)0xc4c8df;
  }
  else {
    local_b8 = pTemp;
  }
  Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",local_b8);
  pcVar9 = "no";
  if (bVar1) {
    pcVar9 = "yes";
  }
  Abc_Print(-2,"\t-o      : toggle printing output status [default = %s]\n",pcVar9);
  pcVar9 = "no";
  if (bVar2) {
    pcVar9 = "yes";
  }
  Abc_Print(-2,"\t-s      : toggle using short print-out [default = %s]\n",pcVar9);
  Abc_Print(-2,"\t-h      : print the command usage\n");
  return 1;
switchD_00263bf6_caseD_73:
  bVar2 = (bool)(bVar2 ^ 1);
  goto LAB_00263bb0;
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex );
    extern void Abc_NtkPrintPoEquivs( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fOutStatus = 0, fShort = 1;
    char * pLogFileName = NULL;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Losh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'o':
            fOutStatus ^= 1;
            break;
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fOutStatus )
    {
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Empty network.\n" );
            return 1;
        }
        Abc_NtkPrintPoEquivs( pNtk );
        return 0;
    }
    if ( !pAbc->vStatuses )
        Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            //printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
//            if ( Counter )
//                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( pLogFileName )
        {
            Abc_Cex_t * pTemp = NULL;
            FILE * pFile = fopen( pLogFileName, "wb" );
            if ( pFile == NULL )
            {
                printf( "Cannot open file \"%s\" for writing.\n", pLogFileName );
                return 0;
            }
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                int Status = Vec_IntEntry( pAbc->vStatuses, c );
                if ( Status == -1 ) // undec
                    fprintf( pFile, "STATUS: ABORTED " );
                else if ( Status == 0 )
                    fprintf( pFile, "STATUS: SAT " );
                else if ( Status == 1 )
                    fprintf( pFile, "STATUS: UNSAT " );
                fprintf( pFile, "%s\n", Abc_ObjName(Abc_NtkPo(pNtk, c)) );
                if ( Status != 0 )
                    continue;
                Abc_NtkDumpOneCexSpecial( pFile, pNtk, pTemp );
            }
            fclose( pFile );
        }
        else if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1),
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-L file] [-osh]\n" );
    Abc_Print( -2, "\t          prints verification status\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n",  pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-o      : toggle printing output status [default = %s]\n", fOutStatus? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}